

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void basic_test(void)

{
  size_t *psVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  char *pcVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  size_t sVar5;
  fdb_config *metalen;
  size_t sVar6;
  fdb_kvs_handle *fconfig_00;
  fdb_config *pfVar7;
  size_t metalen_00;
  size_t bodylen;
  ulong uVar8;
  fdb_config *pfVar9;
  long lVar10;
  uint uVar11;
  fdb_config *unaff_RBP;
  fdb_doc *pfVar12;
  fdb_config *unaff_R12;
  fdb_file_handle **ptr_fhandle;
  fdb_kvs_handle *unaff_R13;
  fdb_config *unaff_R14;
  char *unaff_R15;
  char *kvs_config_00;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_rdonly;
  fdb_kvs_handle *db_rdonly;
  fdb_kvs_config kvs_config;
  fdb_file_info info;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_11e18;
  fdb_kvs_handle *pfStack_11e10;
  fdb_file_handle *pfStack_11e08;
  timeval tStack_11e00;
  fdb_kvs_config fStack_11df0;
  fdb_config fStack_11dd8;
  char acStack_11ce0 [256];
  char *pcStack_11be0;
  fdb_config *pfStack_11bd8;
  fdb_config *pfStack_11bd0;
  fdb_file_handle *pfStack_11bc0;
  fdb_kvs_handle *pfStack_11bb8;
  fdb_kvs_config fStack_11bb0;
  timeval tStack_11b98;
  char acStack_11b88 [264];
  fdb_config fStack_11a80;
  char acStack_11988 [256];
  char acStack_11888 [264];
  char *pcStack_11780;
  fdb_file_handle **ppfStack_11778;
  fdb_kvs_handle *pfStack_11770;
  fdb_config *pfStack_11768;
  fdb_kvs_config *pfStack_11760;
  fdb_config *pfStack_11758;
  fdb_kvs_handle *pfStack_11740;
  fdb_file_handle *pfStack_11738;
  fdb_iterator *pfStack_11730;
  timeval tStack_11728;
  fdb_kvs_config fStack_11718;
  fdb_file_handle *apfStack_11700 [32];
  fdb_config fStack_11600;
  fdb_config fStack_114f8;
  char acStack_11400 [264];
  fdb_config *pfStack_112f8;
  fdb_config *pfStack_112f0;
  fdb_kvs_handle *pfStack_112e8;
  fdb_config *pfStack_112e0;
  fdb_config *pfStack_112d8;
  fdb_config *pfStack_112d0;
  fdb_file_handle *pfStack_112c0;
  fdb_kvs_handle *pfStack_112b8;
  fdb_doc *pfStack_112b0;
  undefined1 auStack_112a8 [40];
  fdb_seqnum_t fStack_11280;
  uint64_t uStack_11278;
  void *pvStack_11270;
  fdb_config *pfStack_11268;
  uint64_t uStack_11260;
  fdb_kvs_config fStack_11258;
  timeval tStack_11240;
  undefined1 auStack_11230 [72];
  fdb_config fStack_111e8;
  char acStack_110e8 [256];
  fdb_config fStack_10fe8;
  fdb_config *pfStack_10ef0;
  fdb_config *pfStack_10ee8;
  fdb_doc *pfStack_10ed0;
  fdb_kvs_handle *pfStack_10ec8;
  fdb_file_handle *pfStack_10ec0;
  fdb_doc *pfStack_10eb8;
  undefined1 auStack_10eb0 [40];
  fdb_seqnum_t fStack_10e88;
  uint64_t uStack_10e80;
  fdb_compaction_callback p_Stack_10e78;
  fdb_config *pfStack_10e70;
  void *pvStack_10e68;
  fdb_kvs_config fStack_10e58;
  timeval tStack_10e40;
  uint8_t auStack_10e30 [256];
  fdb_config fStack_10d30;
  fdb_config fStack_10c30;
  fdb_config *pfStack_10b38;
  fdb_config *pfStack_10b30;
  fdb_file_handle *pfStack_10b20;
  fdb_kvs_handle *pfStack_10b18;
  size_t sStack_10b10;
  int *piStack_10b08;
  timeval tStack_10b00;
  fdb_config fStack_10af0;
  fdb_kvs_handle *pfStack_109f8;
  fdb_file_handle *pfStack_109f0;
  int iStack_109e4;
  undefined1 auStack_109e0 [32];
  timeval tStack_109c0;
  undefined1 auStack_109b0 [76];
  int iStack_10964;
  docio_handle *pdStack_10960;
  uint64_t uStack_108f8;
  undefined1 auStack_10870 [272];
  fdb_config *pfStack_10760;
  fdb_kvs_handle *pfStack_10758;
  size_t *psStack_10750;
  fdb_config *pfStack_10748;
  fdb_config *pfStack_10740;
  fdb_kvs_handle *pfStack_10738;
  fdb_file_handle *pfStack_10730;
  size_t sStack_10728;
  void *pvStack_10720;
  fdb_kvs_config fStack_10718;
  timeval tStack_10700;
  fdb_kvs_handle afStack_106f0 [126];
  undefined1 uStack_679;
  fdb_config *pfStack_670;
  fdb_config *pfStack_668;
  fdb_file_handle *pfStack_660;
  fdb_kvs_handle *pfStack_658;
  fdb_kvs_config fStack_650;
  timeval tStack_638;
  fdb_config fStack_628;
  fdb_config *pfStack_530;
  undefined1 local_520 [16];
  fdb_kvs_handle *local_510;
  undefined1 local_508 [24];
  undefined1 local_4f0 [96];
  fdb_doc *local_490;
  fdb_file_info local_488;
  timeval local_440;
  fdb_config local_430;
  fdb_config local_338;
  fdb_config local_238;
  char local_138 [264];
  
  pfStack_530 = (fdb_config *)0x10f278;
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  pfStack_530 = (fdb_config *)0x10f27d;
  memleak_start();
  local_520._0_8_ = (fdb_config *)0x0;
  pfStack_530 = (fdb_config *)0x10f292;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_530 = (fdb_config *)0x10f297;
  pcVar4 = fdb_get_lib_version();
  if (pcVar4 == (char *)0x0) {
    pfStack_530 = (fdb_config *)0x10f2a1;
    basic_test();
LAB_0010f2a1:
    pfStack_530 = (fdb_config *)0x10f2c0;
    __assert_fail("version != __null && strlen(version) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x37,"void basic_test()");
  }
  if (*pcVar4 == '\0') {
    pfStack_530 = (fdb_config *)0x10f2cd;
    basic_test();
    if ((extraout_RAX & 1) != 0) goto LAB_0010f2a1;
  }
  pfVar9 = &local_430;
  pfStack_530 = (fdb_config *)0x10f2e1;
  fdb_get_default_config();
  pfStack_530 = (fdb_config *)0x10f2ee;
  fdb_get_default_kvs_config();
  local_430.wal_threshold = 0x400;
  local_430.seqtree_opt = '\x01';
  local_430.compaction_threshold = '\0';
  local_430.purging_interval = 1;
  local_430.flags = 0;
  pfStack_530 = (fdb_config *)0x10f320;
  fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",pfVar9);
  if (fVar2 == FDB_RESULT_NO_SUCH_FILE) {
    pfStack_530 = (fdb_config *)0x10f333;
    pcVar4 = fdb_error_msg(FDB_RESULT_NO_SUCH_FILE);
    pfStack_530 = (fdb_config *)0x10f342;
    iVar3 = strcmp(pcVar4,"no such file");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_config *)0x10f34b;
      basic_test();
    }
    local_430.flags = 2;
    pfStack_530 = (fdb_config *)0x10f36b;
    fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",&local_430);
    if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0010fd53;
    local_430.flags = 3;
    pfStack_530 = (fdb_config *)0x10f394;
    fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",&local_430);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_0010fd58;
    pfStack_530 = (fdb_config *)0x10f3a7;
    pcVar4 = fdb_error_msg(FDB_RESULT_INVALID_CONFIG);
    pfStack_530 = (fdb_config *)0x10f3b6;
    iVar3 = strcmp(pcVar4,"invalid configuration");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_config *)0x10f3bf;
      basic_test();
    }
    local_430.flags = 1;
    pfStack_530 = (fdb_config *)0x10f3df;
    fVar2 = fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",&local_430);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd5d;
    pfStack_530 = (fdb_config *)0x10f3ee;
    pcVar4 = fdb_error_msg(FDB_RESULT_SUCCESS);
    pfStack_530 = (fdb_config *)0x10f3fd;
    iVar3 = strcmp(pcVar4,"success");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_config *)0x10f406;
      basic_test();
    }
    pfStack_530 = (fdb_config *)0x10f410;
    pcVar4 = fdb_get_file_version((fdb_file_handle *)local_520._8_8_);
    if (pcVar4 == (char *)0x0) {
      pfStack_530 = (fdb_config *)0x10f41a;
      basic_test();
LAB_0010f41a:
      pfStack_530 = (fdb_config *)0x10f439;
      __assert_fail("file_version != __null && strlen(file_version) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x57,"void basic_test()");
    }
    if (*pcVar4 == '\0') {
      pfStack_530 = (fdb_config *)0x10f446;
      basic_test();
      if ((extraout_RAX_00 & 1) != 0) goto LAB_0010f41a;
    }
    pfStack_530 = (fdb_config *)0x10f457;
    fdb_close((fdb_file_handle *)local_520._8_8_);
    pfStack_530 = (fdb_config *)0x10f463;
    system("rm -rf  dummy* > errorlog.txt");
    pfStack_530 = (fdb_config *)0x10f47a;
    fdb_open((fdb_file_handle **)(local_520 + 8),"./dummy1",&local_430);
    pfVar9 = (fdb_config *)&local_510;
    pfStack_530 = (fdb_config *)0x10f492;
    fdb_kvs_open_default
              ((fdb_file_handle *)local_520._8_8_,(fdb_kvs_handle **)pfVar9,
               (fdb_kvs_config *)(local_4f0 + 0x50));
    pfStack_530 = (fdb_config *)0x10f4a8;
    fVar2 = fdb_set_log_callback(local_510,logCallbackFunc,"basic_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd62;
    unaff_R12 = (fdb_config *)0x0;
    uVar8 = 0;
    do {
      pfStack_530 = (fdb_config *)0x10f4d0;
      sprintf(local_138,"key%d",uVar8 & 0xffffffff);
      pfStack_530 = (fdb_config *)0x10f4e8;
      sprintf((char *)&local_238,"meta%d",uVar8 & 0xffffffff);
      pfStack_530 = (fdb_config *)0x10f500;
      sprintf((char *)&local_338,"body%d",uVar8 & 0xffffffff);
      unaff_R15 = local_508 + (long)unaff_R12 + 0x10;
      pfStack_530 = (fdb_config *)0x10f510;
      unaff_R13 = (fdb_kvs_handle *)strlen(local_138);
      unaff_RBP = &local_238;
      pfStack_530 = (fdb_config *)0x10f523;
      unaff_R14 = (fdb_config *)strlen((char *)unaff_RBP);
      pfStack_530 = (fdb_config *)0x10f533;
      sVar5 = strlen((char *)&local_338);
      pfStack_530 = (fdb_config *)0x10f558;
      fdb_doc_create((fdb_doc **)unaff_R15,local_138,(size_t)unaff_R13,unaff_RBP,(size_t)unaff_R14,
                     &local_338,sVar5);
      pfStack_530 = (fdb_config *)0x10f567;
      fdb_set(local_510,*(fdb_doc **)(local_4f0 + (uVar8 - 1) * 8));
      uVar8 = uVar8 + 1;
      unaff_R12 = (fdb_config *)((long)unaff_R12 + 8);
    } while (uVar8 != 10);
    pfVar9 = (fdb_config *)local_520;
    pfStack_530 = (fdb_config *)0x10f5a4;
    fdb_doc_create((fdb_doc **)pfVar9,
                   (void *)(((atomic<unsigned_long> *)(local_4f0._32_8_ + 0x20))->
                           super___atomic_base<unsigned_long>)._M_i,
                   (((atomic<unsigned_long> *)local_4f0._32_8_)->super___atomic_base<unsigned_long>)
                   ._M_i,(void *)(((kvs_ops_stat *)(local_4f0._32_8_ + 0x38))->num_sets).
                                 super___atomic_base<unsigned_long>._M_i,
                   (((atomic<unsigned_long> *)(local_4f0._32_8_ + 8))->
                   super___atomic_base<unsigned_long>)._M_i,(void *)0x0,0);
    pfStack_530 = (fdb_config *)0x10f5b1;
    fVar2 = fdb_del(local_510,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd67;
    pfStack_530 = (fdb_config *)0x10f5c3;
    fdb_doc_free((fdb_doc *)local_520._0_8_);
    local_520._0_8_ = (fdb_config *)0x0;
    pfStack_530 = (fdb_config *)0x10f5d8;
    fdb_commit((fdb_file_handle *)local_520._8_8_,'\0');
    pfStack_530 = (fdb_config *)0x10f5ed;
    fdb_get_file_info((fdb_file_handle *)local_520._8_8_,&local_488);
    if (local_488.doc_count != 9) {
      pfStack_530 = (fdb_config *)0x10f601;
      basic_test();
    }
    if (local_488.deleted_count != 1) {
      pfStack_530 = (fdb_config *)0x10f619;
      basic_test();
    }
    if (local_488.space_used == 0) {
      pfStack_530 = (fdb_config *)0x10f631;
      basic_test();
    }
    if (local_488.num_kv_stores != 1) {
      pfStack_530 = (fdb_config *)0x10f649;
      basic_test();
    }
    pfVar9 = (fdb_config *)local_520;
    pfStack_530 = (fdb_config *)0x10f672;
    fdb_doc_create((fdb_doc **)pfVar9,
                   (void *)(((atomic<unsigned_long> *)(local_4f0._32_8_ + 0x20))->
                           super___atomic_base<unsigned_long>)._M_i,
                   (((atomic<unsigned_long> *)local_4f0._32_8_)->super___atomic_base<unsigned_long>)
                   ._M_i,(void *)0x0,0,(void *)0x0,0);
    pfStack_530 = (fdb_config *)0x10f67f;
    fVar2 = fdb_get_metaonly(local_510,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd6c;
    pfVar9 = (fdb_config *)local_520._0_8_;
    if ((char)*(uint64_t *)(local_520._0_8_ + 0x48) == '\0') {
      pfStack_530 = (fdb_config *)0x10f6a4;
      basic_test();
      pfVar9 = (fdb_config *)local_508._0_8_;
    }
    unaff_R14 = (fdb_config *)pfVar9->compactor_sleep_duration;
    unaff_R15 = (char *)(((kvs_ops_stat *)(local_4f0._32_8_ + 0x38))->num_sets).
                        super___atomic_base<unsigned_long>._M_i;
    pfStack_530 = (fdb_config *)0x10f6c3;
    iVar3 = bcmp(unaff_R14,unaff_R15,pfVar9->buffercache_size);
    if (iVar3 != 0) goto LAB_0010fd71;
    pfStack_530 = (fdb_config *)0x10f6d3;
    fdb_doc_free((fdb_doc *)pfVar9);
    local_520._0_8_ = (fdb_config *)0x0;
    pfVar9 = (fdb_config *)&local_510;
    pfStack_530 = (fdb_config *)0x10f6e9;
    fdb_kvs_close(local_510);
    unaff_R14 = (fdb_config *)(local_520 + 8);
    pfStack_530 = (fdb_config *)0x10f6f6;
    fdb_close((fdb_file_handle *)local_520._8_8_);
    pfStack_530 = (fdb_config *)0x10f70d;
    fdb_open((fdb_file_handle **)unaff_R14,"./dummy1",&local_430);
    pfStack_530 = (fdb_config *)0x10f720;
    fdb_kvs_open_default
              ((fdb_file_handle *)local_520._8_8_,(fdb_kvs_handle **)pfVar9,
               (fdb_kvs_config *)(local_4f0 + 0x50));
    pfStack_530 = (fdb_config *)0x10f736;
    fVar2 = fdb_set_log_callback(local_510,logCallbackFunc,"basic_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd7c;
    pfVar9 = (fdb_config *)0x0;
    pfStack_530 = (fdb_config *)0x10f75b;
    sprintf((char *)&local_238,"meta2%d",0);
    pfVar7 = &local_338;
    pfStack_530 = (fdb_config *)0x10f779;
    sprintf((char *)pfVar7,"body2%d",0);
    pfStack_530 = (fdb_config *)0x10f781;
    metalen = (fdb_config *)strlen((char *)&local_238);
    pfStack_530 = (fdb_config *)0x10f78c;
    sVar5 = strlen((char *)pfVar7);
    pfStack_530 = (fdb_config *)0x10f7a5;
    fdb_doc_update((fdb_doc **)(local_508 + 0x10),&local_238,(size_t)metalen,pfVar7,sVar5);
    pfStack_530 = (fdb_config *)0x10f7b3;
    fdb_set(local_510,(fdb_doc *)local_508._16_8_);
    pfStack_530 = (fdb_config *)0x10f7c9;
    sprintf((char *)&local_238,"meta2%d",1);
    pfStack_530 = (fdb_config *)0x10f7db;
    sprintf((char *)pfVar7,"body2%d",1);
    unaff_R13 = (fdb_kvs_handle *)local_4f0;
    pfStack_530 = (fdb_config *)0x10f7e8;
    unaff_R12 = (fdb_config *)strlen((char *)&local_238);
    pfStack_530 = (fdb_config *)0x10f7f3;
    sVar5 = strlen((char *)pfVar7);
    pfStack_530 = (fdb_config *)0x10f807;
    fdb_doc_update((fdb_doc **)unaff_R13,&local_238,(size_t)unaff_R12,pfVar7,sVar5);
    pfStack_530 = (fdb_config *)0x10f815;
    fdb_set(local_510,(fdb_doc *)local_4f0._0_8_);
    pfStack_530 = (fdb_config *)0x10f821;
    fdb_commit((fdb_file_handle *)local_520._8_8_,'\0');
    do {
      pfStack_530 = (fdb_config *)0x10f84a;
      fdb_doc_create((fdb_doc **)local_520,
                     (void *)(*(size_t **)(local_4f0 + (long)&pfVar9[-1].field_0xf7 * 8))[4],
                     **(size_t **)(local_4f0 + (long)&pfVar9[-1].field_0xf7 * 8),(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_530 = (fdb_config *)0x10f859;
      fVar2 = fdb_get(local_510,(fdb_doc *)local_520._0_8_);
      unaff_RBP = (fdb_config *)local_520._0_8_;
      if (pfVar9 == (fdb_config *)0x5) {
        unaff_RBP = metalen;
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010fd29;
        pfStack_530 = (fdb_config *)0x10f872;
        pcVar4 = fdb_error_msg(FDB_RESULT_KEY_NOT_FOUND);
        pfStack_530 = (fdb_config *)0x10f881;
        iVar3 = strcmp(pcVar4,"key not found");
        if (iVar3 != 0) {
          pfStack_530 = (fdb_config *)0x10f88a;
          basic_test();
        }
      }
      else {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd19;
        unaff_R12 = *(fdb_config **)(local_520._0_8_ + 0x38);
        pfVar7 = *(fdb_config **)(local_4f0 + (long)&pfVar9[-1].field_0xf7 * 8);
        unaff_R13 = (fdb_kvs_handle *)pfVar7->compactor_sleep_duration;
        pfStack_530 = (fdb_config *)0x10f8b5;
        iVar3 = bcmp(unaff_R12,unaff_R13,*(uint64_t *)(local_520._0_8_ + 8));
        if (iVar3 != 0) goto LAB_0010fd1e;
        unaff_R12 = *(fdb_config **)((long)unaff_RBP + 0x40);
        unaff_R13 = *(fdb_kvs_handle **)&pfVar7->multi_kv_instances;
        pfStack_530 = (fdb_config *)0x10f8d4;
        iVar3 = bcmp(unaff_R12,unaff_R13,*(uint64_t *)((long)unaff_RBP + 0x10));
        if (iVar3 != 0) goto LAB_0010fd0e;
      }
      pfStack_530 = (fdb_config *)0x10f8e6;
      fdb_doc_free((fdb_doc *)local_520._0_8_);
      local_520._0_8_ = (fdb_config *)0x0;
      pfVar9 = (fdb_config *)((long)&pfVar9->chunksize + 1);
      metalen = unaff_RBP;
    } while (pfVar9 != (fdb_config *)0xa);
    pfStack_530 = (fdb_config *)0x10f90d;
    fdb_compact((fdb_file_handle *)local_520._8_8_,"./dummy2");
    pfVar9 = (fdb_config *)0x0;
    unaff_R15 = (char *)pfVar7;
    do {
      pfStack_530 = (fdb_config *)0x10f938;
      fdb_doc_create((fdb_doc **)local_520,
                     (void *)(*(size_t **)(local_4f0 + (long)&pfVar9[-1].field_0xf7 * 8))[4],
                     **(size_t **)(local_4f0 + (long)&pfVar9[-1].field_0xf7 * 8),(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_530 = (fdb_config *)0x10f947;
      fVar2 = fdb_get(local_510,(fdb_doc *)local_520._0_8_);
      pfVar7 = (fdb_config *)local_520._0_8_;
      if (pfVar9 == (fdb_config *)0x5) {
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010fd49;
      }
      else {
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd39;
        unaff_R12 = *(fdb_config **)(local_520._0_8_ + 0x38);
        unaff_RBP = *(fdb_config **)(local_4f0 + (long)&pfVar9[-1].field_0xf7 * 8);
        unaff_R13 = (fdb_kvs_handle *)unaff_RBP->compactor_sleep_duration;
        pfStack_530 = (fdb_config *)0x10f986;
        iVar3 = bcmp(unaff_R12,unaff_R13,*(uint64_t *)(local_520._0_8_ + 8));
        if (iVar3 != 0) goto LAB_0010fd3e;
        unaff_R12 = *(fdb_config **)((long)pfVar7 + 0x40);
        unaff_R13 = *(fdb_kvs_handle **)&unaff_RBP->multi_kv_instances;
        pfStack_530 = (fdb_config *)0x10f9a5;
        iVar3 = bcmp(unaff_R12,unaff_R13,*(uint64_t *)((long)pfVar7 + 0x10));
        if (iVar3 != 0) goto LAB_0010fd2e;
      }
      pfStack_530 = (fdb_config *)0x10f9b5;
      fdb_doc_free((fdb_doc *)pfVar7);
      local_520._0_8_ = (fdb_config *)0x0;
      pfVar9 = (fdb_config *)((long)&pfVar9->chunksize + 1);
      unaff_R15 = (char *)pfVar7;
    } while (pfVar9 != (fdb_config *)0xa);
    unaff_R14 = (fdb_config *)local_520;
    pfVar9 = (fdb_config *)0x3dc;
    pfVar7 = (fdb_config *)0x0;
    do {
      local_520._0_8_ = (fdb_config *)0x0;
      pfStack_530 = (fdb_config *)0x10f9f4;
      fdb_doc_create((fdb_doc **)unaff_R14,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
      unaff_R12 = (fdb_config *)((long)&pfVar7->chunksize + 1);
      *(fdb_config **)(local_520._0_8_ + 0x28) = unaff_R12;
      pfStack_530 = (fdb_config *)0x10fa0b;
      fVar2 = fdb_get_byseq(local_510,(fdb_doc *)local_520._0_8_);
      if (((fdb_config *)0xa < pfVar7) ||
         (((uint)pfVar7 < 10 && ((0x3dcU >> ((uint)pfVar7 & 0x1f) & 1) != 0)))) {
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0010fa25;
        pfStack_530 = (fdb_config *)0x10fd0e;
        basic_test();
LAB_0010fd0e:
        pfStack_530 = (fdb_config *)0x10fd19;
        basic_test();
        metalen = unaff_RBP;
LAB_0010fd19:
        unaff_RBP = metalen;
        pfStack_530 = (fdb_config *)0x10fd1e;
        basic_test();
LAB_0010fd1e:
        pfStack_530 = (fdb_config *)0x10fd29;
        basic_test();
LAB_0010fd29:
        pfStack_530 = (fdb_config *)0x10fd2e;
        basic_test();
LAB_0010fd2e:
        pfStack_530 = (fdb_config *)0x10fd39;
        basic_test();
        unaff_R15 = (char *)pfVar7;
LAB_0010fd39:
        pfVar7 = (fdb_config *)unaff_R15;
        pfStack_530 = (fdb_config *)0x10fd3e;
        basic_test();
LAB_0010fd3e:
        pfStack_530 = (fdb_config *)0x10fd49;
        basic_test();
        unaff_R15 = (char *)pfVar7;
LAB_0010fd49:
        unaff_R14 = (fdb_config *)local_520;
        pfStack_530 = (fdb_config *)0x10fd4e;
        basic_test();
        goto LAB_0010fd4e;
      }
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) {
        pfStack_530 = (fdb_config *)0x10fa4d;
        basic_test();
        unaff_R15 = (char *)pfVar7;
        break;
      }
LAB_0010fa25:
      pfStack_530 = (fdb_config *)0x10fa2f;
      fdb_doc_free((fdb_doc *)local_520._0_8_);
      local_520._0_8_ = (fdb_config *)0x0;
      pfVar7 = unaff_R12;
      unaff_R15 = (char *)unaff_R12;
    } while (unaff_R12 != (fdb_config *)0xd);
    pfVar9 = (fdb_config *)local_520;
    pfStack_530 = (fdb_config *)0x10fa79;
    fdb_doc_create((fdb_doc **)pfVar9,
                   (void *)(((atomic<unsigned_long> *)(local_4f0._32_8_ + 0x20))->
                           super___atomic_base<unsigned_long>)._M_i,
                   (((atomic<unsigned_long> *)local_4f0._32_8_)->super___atomic_base<unsigned_long>)
                   ._M_i,(void *)(((kvs_ops_stat *)(local_4f0._32_8_ + 0x38))->num_sets).
                                 super___atomic_base<unsigned_long>._M_i,
                   (((atomic<unsigned_long> *)(local_4f0._32_8_ + 8))->
                   super___atomic_base<unsigned_long>)._M_i,(void *)0x0,0);
    pfStack_530 = (fdb_config *)0x10fa86;
    fVar2 = fdb_set(local_510,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd81;
    pfVar9 = (fdb_config *)local_520;
    pfStack_530 = (fdb_config *)0x10fa9b;
    fdb_doc_free((fdb_doc *)local_520._0_8_);
    unaff_R14 = (fdb_config *)0x0;
    local_520._0_8_ = (fdb_config *)0x0;
    pfStack_530 = (fdb_config *)0x10faad;
    fdb_commit((fdb_file_handle *)local_520._8_8_,'\0');
    pfStack_530 = (fdb_config *)0x10facd;
    fdb_doc_create((fdb_doc **)pfVar9,
                   (void *)(((atomic<unsigned_long> *)(local_4f0._32_8_ + 0x20))->
                           super___atomic_base<unsigned_long>)._M_i,
                   (((atomic<unsigned_long> *)local_4f0._32_8_)->super___atomic_base<unsigned_long>)
                   ._M_i,(void *)0x0,0,(void *)0x0,0);
    pfStack_530 = (fdb_config *)0x10fada;
    fVar2 = fdb_get(local_510,(fdb_doc *)local_520._0_8_);
    pfVar7 = (fdb_config *)local_520._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd86;
    pfStack_530 = (fdb_config *)0x10fafd;
    iVar3 = bcmp(*(void **)(local_520._0_8_ + 0x38),
                 (void *)(((kvs_ops_stat *)(local_4f0._32_8_ + 0x38))->num_sets).
                         super___atomic_base<unsigned_long>._M_i,*(uint64_t *)(local_520._0_8_ + 8))
    ;
    if (iVar3 != 0) {
      pfVar9 = (fdb_config *)local_508;
      pfStack_530 = (fdb_config *)0x10fb18;
      basic_test();
      pfVar7 = (fdb_config *)local_508._0_8_;
    }
    if (*(long *)&pfVar7->multi_kv_instances != 0) {
      pfVar9 = (fdb_config *)local_508;
      pfStack_530 = (fdb_config *)0x10fb34;
      basic_test();
      pfVar7 = (fdb_config *)local_508._0_8_;
    }
    unaff_R14 = pfVar7;
    if (pfVar7->wal_threshold != 0) {
      pfVar9 = (fdb_config *)local_508;
      pfStack_530 = (fdb_config *)0x10fb50;
      basic_test();
      unaff_R14 = (fdb_config *)local_508._0_8_;
    }
    pfStack_530 = (fdb_config *)0x10fb5b;
    fdb_doc_free((fdb_doc *)unaff_R14);
    local_520._0_8_ = (fdb_config *)0x0;
    local_430.flags = 2;
    pfStack_530 = (fdb_config *)0x10fb84;
    fVar2 = fdb_open((fdb_file_handle **)local_508,"./dummy2",&local_430);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd8b;
    pfStack_530 = (fdb_config *)0x10fba3;
    fVar2 = fdb_kvs_open_default
                      ((fdb_file_handle *)local_508._0_8_,(fdb_kvs_handle **)(local_508 + 8),
                       (fdb_kvs_config *)(local_4f0 + 0x50));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd90;
    pfVar9 = (fdb_config *)local_520;
    pfStack_530 = (fdb_config *)0x10fbd4;
    fdb_doc_create((fdb_doc **)pfVar9,*(void **)(local_508._16_8_ + 0x20),
                   *(size_t *)local_508._16_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_530 = (fdb_config *)0x10fbe1;
    fVar2 = fdb_get((fdb_kvs_handle *)local_508._8_8_,(fdb_doc *)local_520._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd95;
    pfStack_530 = (fdb_config *)0x10fc01;
    fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_508._8_8_,logCallbackFunc,"basic_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fd9a;
    pfStack_530 = (fdb_config *)0x10fc1b;
    fVar2 = fdb_set((fdb_kvs_handle *)local_508._8_8_,local_490);
    if (fVar2 != FDB_RESULT_RONLY_VIOLATION) goto LAB_0010fd9f;
    pfStack_530 = (fdb_config *)0x10fc2e;
    pcVar4 = fdb_error_msg(FDB_RESULT_RONLY_VIOLATION);
    pfStack_530 = (fdb_config *)0x10fc3d;
    iVar3 = strcmp(pcVar4,"database is read-only");
    if (iVar3 != 0) {
      pfStack_530 = (fdb_config *)0x10fc46;
      basic_test();
    }
    pfStack_530 = (fdb_config *)0x10fc52;
    fVar2 = fdb_commit((fdb_file_handle *)local_508._0_8_,'\0');
    if (fVar2 == FDB_RESULT_RONLY_VIOLATION) {
      pfStack_530 = (fdb_config *)0x10fc65;
      fdb_doc_free((fdb_doc *)local_520._0_8_);
      local_520._0_8_ = (fdb_doc *)0x0;
      pfStack_530 = (fdb_config *)0x10fc78;
      fdb_kvs_close((fdb_kvs_handle *)local_508._8_8_);
      pfStack_530 = (fdb_config *)0x10fc82;
      fdb_close((fdb_file_handle *)local_508._0_8_);
      lVar10 = 0;
      do {
        pfStack_530 = (fdb_config *)0x10fc8e;
        fdb_doc_free(*(fdb_doc **)(local_4f0 + (lVar10 + -1) * 8));
        lVar10 = lVar10 + 1;
      } while (lVar10 != 10);
      pfStack_530 = (fdb_config *)0x10fca8;
      fdb_compact((fdb_file_handle *)local_520._8_8_,"./dummy3");
      pfStack_530 = (fdb_config *)0x10fcb2;
      fdb_kvs_close(local_510);
      pfStack_530 = (fdb_config *)0x10fcbc;
      fdb_close((fdb_file_handle *)local_520._8_8_);
      pfStack_530 = (fdb_config *)0x10fcc1;
      fdb_shutdown();
      pfStack_530 = (fdb_config *)0x10fcc6;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (basic_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_530 = (fdb_config *)0x10fcf7;
      fprintf(_stderr,pcVar4,"basic test");
      return;
    }
  }
  else {
LAB_0010fd4e:
    pfStack_530 = (fdb_config *)0x10fd53;
    basic_test();
LAB_0010fd53:
    pfStack_530 = (fdb_config *)0x10fd58;
    basic_test();
LAB_0010fd58:
    pfStack_530 = (fdb_config *)0x10fd5d;
    basic_test();
LAB_0010fd5d:
    pfStack_530 = (fdb_config *)0x10fd62;
    basic_test();
LAB_0010fd62:
    pfStack_530 = (fdb_config *)0x10fd67;
    basic_test();
LAB_0010fd67:
    pfStack_530 = (fdb_config *)0x10fd6c;
    basic_test();
LAB_0010fd6c:
    pfStack_530 = (fdb_config *)0x10fd71;
    basic_test();
LAB_0010fd71:
    pfStack_530 = (fdb_config *)0x10fd7c;
    basic_test();
LAB_0010fd7c:
    pfStack_530 = (fdb_config *)0x10fd81;
    basic_test();
LAB_0010fd81:
    pfStack_530 = (fdb_config *)0x10fd86;
    basic_test();
LAB_0010fd86:
    pfStack_530 = (fdb_config *)0x10fd8b;
    basic_test();
LAB_0010fd8b:
    pfStack_530 = (fdb_config *)0x10fd90;
    basic_test();
LAB_0010fd90:
    pfStack_530 = (fdb_config *)0x10fd95;
    basic_test();
LAB_0010fd95:
    pfStack_530 = (fdb_config *)0x10fd9a;
    basic_test();
LAB_0010fd9a:
    pfStack_530 = (fdb_config *)0x10fd9f;
    basic_test();
LAB_0010fd9f:
    pfStack_530 = (fdb_config *)0x10fda4;
    basic_test();
  }
  pfStack_530 = (fdb_config *)init_test;
  basic_test();
  pfStack_668 = (fdb_config *)0x10fdbd;
  pfStack_530 = pfVar9;
  gettimeofday(&tStack_638,(__timezone_ptr_t)0x0);
  pfStack_668 = (fdb_config *)0x10fdc2;
  memleak_start();
  pfStack_668 = (fdb_config *)0x10fdcf;
  fdb_get_default_config();
  pfStack_668 = (fdb_config *)0x10fdd9;
  fdb_get_default_kvs_config();
  pfStack_668 = (fdb_config *)0x10fde5;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_668 = (fdb_config *)0x10fded;
  fVar2 = fdb_init(&fStack_628);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_668 = (fdb_config *)0x10fe09;
    fVar2 = fdb_open(&pfStack_660,"./dummy1",&fStack_628);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fe7e;
    pfStack_668 = (fdb_config *)0x10fe20;
    fVar2 = fdb_kvs_open_default(pfStack_660,&pfStack_658,&fStack_650);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fe83;
    pfStack_668 = (fdb_config *)0x10fe2d;
    fVar2 = fdb_close(pfStack_660);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fe88;
    pfStack_668 = (fdb_config *)0x10fe36;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_668 = (fdb_config *)0x10fe3f;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (init_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_668 = (fdb_config *)0x10fe70;
      fprintf(_stderr,pcVar4,"init test");
      return;
    }
  }
  else {
    pfStack_668 = (fdb_config *)0x10fe7e;
    init_test();
LAB_0010fe7e:
    pfStack_668 = (fdb_config *)0x10fe83;
    init_test();
LAB_0010fe83:
    pfStack_668 = (fdb_config *)0x10fe88;
    init_test();
LAB_0010fe88:
    pfStack_668 = (fdb_config *)0x10fe8d;
    init_test();
  }
  pfStack_668 = (fdb_config *)set_get_max_keylen;
  init_test();
  pfStack_10740 = (fdb_config *)0x10fea8;
  pfStack_670 = &fStack_628;
  pfStack_668 = unaff_R14;
  gettimeofday(&tStack_10700,(__timezone_ptr_t)0x0);
  pfStack_10740 = (fdb_config *)0x10fead;
  memleak_start();
  pfStack_10740 = (fdb_config *)0x10feb7;
  fdb_get_default_kvs_config();
  fconfig_00 = afStack_106f0;
  pfStack_10740 = (fdb_config *)0x10fec4;
  fdb_get_default_config();
  afStack_106f0[0].kvs_config.create_if_missing = true;
  afStack_106f0[0].kvs_config._1_1_ = 0;
  pfStack_10740 = (fdb_config *)0x10fed5;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10740 = (fdb_config *)0x10feef;
  memset(&afStack_106f0[0].config.num_bgflusher_threads,0x61,0xff80);
  uStack_679 = 0;
  pfStack_10740 = (fdb_config *)0x10ff0b;
  fVar2 = fdb_open(&pfStack_10730,"./dummy1",(fdb_config *)fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10740 = (fdb_config *)0x10ff25;
    fVar2 = fdb_kvs_open_default(pfStack_10730,&pfStack_10738,&fStack_10718);
    handle = pfStack_10738;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fff5;
    psVar1 = &afStack_106f0[0].config.num_bgflusher_threads;
    pfStack_10740 = (fdb_config *)0x10ff41;
    sVar5 = strlen((char *)psVar1);
    pfStack_10740 = (fdb_config *)0x10ff54;
    fVar2 = fdb_set_kv(handle,psVar1,sVar5,(void *)0x0,0);
    fconfig_00 = handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fffa;
    pfStack_10740 = (fdb_config *)0x10ff67;
    fVar2 = fdb_get(pfStack_10738,(fdb_doc *)0x0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_0010ffff;
    psVar1 = &afStack_106f0[0].config.num_bgflusher_threads;
    pfStack_10740 = (fdb_config *)0x10ff84;
    sVar5 = strlen((char *)psVar1);
    pfStack_10740 = (fdb_config *)0x10ff9c;
    fVar2 = fdb_get_kv(pfStack_10738,psVar1,sVar5,&pvStack_10720,&sStack_10728);
    fconfig_00 = pfStack_10738;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10740 = (fdb_config *)0x10ffaa;
      fdb_close(pfStack_10730);
      pfStack_10740 = (fdb_config *)0x10ffaf;
      fdb_shutdown();
      pfStack_10740 = (fdb_config *)0x10ffb4;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (set_get_max_keylen()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_10740 = (fdb_config *)0x10ffe5;
      fprintf(_stderr,pcVar4,"set get max keylen");
      return;
    }
  }
  else {
    pfStack_10740 = (fdb_config *)0x10fff5;
    set_get_max_keylen();
LAB_0010fff5:
    pfStack_10740 = (fdb_config *)0x10fffa;
    set_get_max_keylen();
LAB_0010fffa:
    pfStack_10740 = (fdb_config *)0x10ffff;
    set_get_max_keylen();
LAB_0010ffff:
    pfStack_10740 = (fdb_config *)0x110004;
    set_get_max_keylen();
  }
  pfVar9 = (fdb_config *)&afStack_106f0[0].config.num_bgflusher_threads;
  pfStack_10740 = (fdb_config *)config_test;
  set_get_max_keylen();
  pfStack_109f8 = (fdb_kvs_handle *)0x110026;
  auStack_10870._264_8_ = fconfig_00;
  pfStack_10760 = unaff_R12;
  pfStack_10758 = unaff_R13;
  psStack_10750 = (size_t *)pfVar9;
  pfStack_10748 = (fdb_config *)unaff_R15;
  pfStack_10740 = unaff_RBP;
  gettimeofday(&tStack_109c0,(__timezone_ptr_t)0x0);
  pfStack_109f8 = (fdb_kvs_handle *)0x11002b;
  memleak_start();
  pfStack_109f8 = (fdb_kvs_handle *)0x110037;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_109f8 = (fdb_kvs_handle *)0x11003c;
  sVar6 = fdb_get_buffer_cache_used();
  if (sVar6 == 0) {
    fconfig_00 = (fdb_kvs_handle *)auStack_10870;
    pfStack_109f8 = (fdb_kvs_handle *)0x110055;
    fdb_get_default_config();
    pfVar9 = (fdb_config *)(auStack_109b0 + 0x48);
    pfStack_109f8 = (fdb_kvs_handle *)0x11006d;
    memcpy(pfVar9,fconfig_00,0xf8);
    pdStack_10960 = (docio_handle *)0xffffffffffffffff;
    pfStack_109f8 = (fdb_kvs_handle *)0x110087;
    fVar2 = fdb_open(&pfStack_109f0,"./dummy1",pfVar9);
    if (fVar2 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_001102ee;
    fconfig_00 = (fdb_kvs_handle *)auStack_10870;
    pfStack_109f8 = (fdb_kvs_handle *)0x1100a0;
    fdb_get_default_config();
    pfVar9 = (fdb_config *)(auStack_109b0 + 0x48);
    pfStack_109f8 = (fdb_kvs_handle *)0x1100b8;
    memcpy(pfVar9,fconfig_00,0xf8);
    uStack_108f8 = 0x78;
    pfStack_109f8 = (fdb_kvs_handle *)0x1100d2;
    fVar2 = fdb_open(&pfStack_109f0,"./dummy1",pfVar9);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_001102f3;
    pfVar9 = (fdb_config *)auStack_10870;
    pfStack_109f8 = (fdb_kvs_handle *)0x1100eb;
    fdb_get_default_config();
    pfStack_109f8 = (fdb_kvs_handle *)0x110100;
    memcpy(auStack_109b0 + 0x48,pfVar9,0xf8);
    pfStack_109f8 = (fdb_kvs_handle *)0x11010a;
    fdb_get_default_kvs_config();
    unaff_RBP = (fdb_config *)0x4;
    unaff_R15 = "justonekv";
    unaff_R12 = (fdb_config *)auStack_109e0;
    unaff_R13 = (fdb_kvs_handle *)auStack_109b0;
    do {
      pfStack_109f8 = (fdb_kvs_handle *)0x110133;
      sprintf((char *)pfVar9,"dummy%d",unaff_RBP);
      pfStack_109f8 = (fdb_kvs_handle *)0x110146;
      fVar2 = fdb_open(&pfStack_109f0,(char *)pfVar9,(fdb_config *)(auStack_109b0 + 0x48));
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001102da:
        pfStack_109f8 = (fdb_kvs_handle *)0x1102df;
        config_test();
LAB_001102df:
        pfStack_109f8 = (fdb_kvs_handle *)0x1102e4;
        config_test();
LAB_001102e4:
        pfStack_109f8 = (fdb_kvs_handle *)0x1102e9;
        config_test();
        goto LAB_001102e9;
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x110162;
      fVar2 = fdb_kvs_open(pfStack_109f0,(fdb_kvs_handle **)unaff_R12,"justonekv",
                           (fdb_kvs_config *)(auStack_109e0 + 8));
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_109f8 = (fdb_kvs_handle *)0x1102da;
        config_test();
        goto LAB_001102da;
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x11016f;
      fconfig_00 = (fdb_kvs_handle *)fdb_get_buffer_cache_used();
      pfStack_109f8 = (fdb_kvs_handle *)0x11017e;
      fVar2 = fdb_get_file_info(pfStack_109f0,(fdb_file_info *)unaff_R13);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102e4;
      iVar3 = iStack_10964;
      if ((fdb_file_handle *)auStack_109b0._40_8_ !=
          (fdb_file_handle *)(ulong)(uint)(iStack_10964 * 7)) {
        pfStack_109f8 = (fdb_kvs_handle *)0x1101d6;
        config_test();
        iVar3 = iStack_109e4;
      }
      if (fconfig_00 != (fdb_kvs_handle *)(ulong)(uint)(iVar3 * 2)) {
        pfStack_109f8 = (fdb_kvs_handle *)0x1101ec;
        config_test();
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x1101ad;
      fVar2 = fdb_close(pfStack_109f0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102df;
      uVar11 = (int)unaff_RBP - 1;
      unaff_RBP = (fdb_config *)(ulong)uVar11;
    } while (uVar11 != 0);
    pfStack_109f8 = (fdb_kvs_handle *)0x110206;
    fVar2 = fdb_open(&pfStack_109f0,auStack_10870,(fdb_config *)(auStack_109b0 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102f8;
    pfStack_109f8 = (fdb_kvs_handle *)0x110228;
    fVar2 = fdb_kvs_open(pfStack_109f0,(fdb_kvs_handle **)auStack_109e0,"justonekv",
                         (fdb_kvs_config *)(auStack_109e0 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001102fd;
    pfStack_109f8 = (fdb_kvs_handle *)0x110253;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)auStack_109e0._0_8_,"key",3,"body",5);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_109f8 = (fdb_kvs_handle *)0x110260;
      sVar6 = fdb_get_buffer_cache_used();
      if (sVar6 != (uint)(iStack_10964 << 3)) {
        pfStack_109f8 = (fdb_kvs_handle *)0x11027f;
        config_test();
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x110288;
      fdb_close(pfStack_109f0);
      pfStack_109f8 = (fdb_kvs_handle *)0x11028d;
      fdb_shutdown();
      pfStack_109f8 = (fdb_kvs_handle *)0x110292;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_109f8 = (fdb_kvs_handle *)0x1102c3;
      fprintf(_stderr,pcVar4,"forestdb config test");
      return;
    }
  }
  else {
LAB_001102e9:
    pfStack_109f8 = (fdb_kvs_handle *)0x1102ee;
    config_test();
LAB_001102ee:
    pfStack_109f8 = (fdb_kvs_handle *)0x1102f3;
    config_test();
LAB_001102f3:
    pfStack_109f8 = (fdb_kvs_handle *)0x1102f8;
    config_test();
LAB_001102f8:
    pfStack_109f8 = (fdb_kvs_handle *)0x1102fd;
    config_test();
LAB_001102fd:
    pfStack_109f8 = (fdb_kvs_handle *)0x110302;
    config_test();
  }
  pfStack_109f8 = (fdb_kvs_handle *)delete_reopen_test;
  config_test();
  pfStack_10b30 = (fdb_config *)0x11031b;
  pfStack_109f8 = fconfig_00;
  gettimeofday(&tStack_10b00,(__timezone_ptr_t)0x0);
  pfStack_10b30 = (fdb_config *)0x110320;
  memleak_start();
  pfStack_10b30 = (fdb_config *)0x11032c;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10b30 = (fdb_config *)0x110339;
  fdb_get_default_config();
  fStack_10af0.buffercache_size = 0;
  fStack_10af0.num_compactor_threads = 1;
  pfStack_10b30 = (fdb_config *)0x11035d;
  fVar2 = fdb_open(&pfStack_10b20,"./dummy3",&fStack_10af0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10b30 = (fdb_config *)0x110376;
    fVar2 = fdb_kvs_open_default(pfStack_10b20,&pfStack_10b18,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011056d;
    pfStack_10b30 = (fdb_config *)0x11038d;
    fVar2 = fdb_begin_transaction(pfStack_10b20,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110572;
    pfStack_10b30 = (fdb_config *)0x1103b8;
    fVar2 = fdb_set_kv(pfStack_10b18,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110577;
    pfStack_10b30 = (fdb_config *)0x1103cc;
    fVar2 = fdb_end_transaction(pfStack_10b20,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011057c;
    pfStack_10b30 = (fdb_config *)0x1103f4;
    fVar2 = fdb_get_kv(pfStack_10b18,"foo",3,&piStack_10b08,&sStack_10b10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110581;
    if (sStack_10b10 != 5) {
      pfStack_10b30 = (fdb_config *)0x11040e;
      delete_reopen_test();
    }
    if ((char)piStack_10b08[1] != 'e' || *piStack_10b08 != 0x756c6176) goto LAB_00110586;
    pfStack_10b30 = (fdb_config *)0x11042e;
    fdb_free_block(piStack_10b08);
    pfStack_10b30 = (fdb_config *)0x11043d;
    fVar2 = fdb_begin_transaction(pfStack_10b20,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058b;
    pfStack_10b30 = (fdb_config *)0x11045b;
    fVar2 = fdb_del_kv(pfStack_10b18,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110590;
    pfStack_10b30 = (fdb_config *)0x11046f;
    fVar2 = fdb_end_transaction(pfStack_10b20,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110595;
    pfStack_10b30 = (fdb_config *)0x110497;
    fVar2 = fdb_get_kv(pfStack_10b18,"foo",3,&piStack_10b08,&sStack_10b10);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011059a;
    pfStack_10b30 = (fdb_config *)0x1104aa;
    fVar2 = fdb_close(pfStack_10b20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059f;
    pfStack_10b30 = (fdb_config *)0x1104c8;
    fVar2 = fdb_open(&pfStack_10b20,"./dummy3",&fStack_10af0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a4;
    pfStack_10b30 = (fdb_config *)0x1104e1;
    fVar2 = fdb_kvs_open_default(pfStack_10b20,&pfStack_10b18,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a9;
    pfStack_10b30 = (fdb_config *)0x110509;
    fVar2 = fdb_get_kv(pfStack_10b18,"foo",3,&piStack_10b08,&sStack_10b10);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105ae;
    pfStack_10b30 = (fdb_config *)0x11051c;
    fVar2 = fdb_close(pfStack_10b20);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10b30 = (fdb_config *)0x110529;
      fdb_shutdown();
      pfStack_10b30 = (fdb_config *)0x11052e;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_10b30 = (fdb_config *)0x11055f;
      fprintf(_stderr,pcVar4,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_10b30 = (fdb_config *)0x11056d;
    delete_reopen_test();
LAB_0011056d:
    pfStack_10b30 = (fdb_config *)0x110572;
    delete_reopen_test();
LAB_00110572:
    pfStack_10b30 = (fdb_config *)0x110577;
    delete_reopen_test();
LAB_00110577:
    pfStack_10b30 = (fdb_config *)0x11057c;
    delete_reopen_test();
LAB_0011057c:
    pfStack_10b30 = (fdb_config *)0x110581;
    delete_reopen_test();
LAB_00110581:
    pfStack_10b30 = (fdb_config *)0x110586;
    delete_reopen_test();
LAB_00110586:
    pfStack_10b30 = (fdb_config *)0x11058b;
    delete_reopen_test();
LAB_0011058b:
    pfStack_10b30 = (fdb_config *)0x110590;
    delete_reopen_test();
LAB_00110590:
    pfStack_10b30 = (fdb_config *)0x110595;
    delete_reopen_test();
LAB_00110595:
    pfStack_10b30 = (fdb_config *)0x11059a;
    delete_reopen_test();
LAB_0011059a:
    pfStack_10b30 = (fdb_config *)0x11059f;
    delete_reopen_test();
LAB_0011059f:
    pfStack_10b30 = (fdb_config *)0x1105a4;
    delete_reopen_test();
LAB_001105a4:
    pfStack_10b30 = (fdb_config *)0x1105a9;
    delete_reopen_test();
LAB_001105a9:
    pfStack_10b30 = (fdb_config *)0x1105ae;
    delete_reopen_test();
LAB_001105ae:
    pfStack_10b30 = (fdb_config *)0x1105b3;
    delete_reopen_test();
  }
  pfStack_10b30 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_10ee8 = (fdb_config *)0x1105d1;
  pfStack_10b38 = &fStack_10af0;
  pfStack_10b30 = pfVar9;
  gettimeofday(&tStack_10e40,(__timezone_ptr_t)0x0);
  pfStack_10ee8 = (fdb_config *)0x1105d6;
  memleak_start();
  pfStack_10ee8 = (fdb_config *)0x1105e2;
  system("rm -rf  dummy* > errorlog.txt");
  pvStack_10e68 = (void *)0x0;
  auStack_10eb0._0_8_ = 0;
  auStack_10eb0._8_8_ = 0;
  auStack_10eb0._16_8_ = 0;
  auStack_10eb0._24_8_ = 0;
  uStack_10e80 = 0;
  p_Stack_10e78 = (fdb_compaction_callback)0x0;
  auStack_10eb0._32_8_ = auStack_10e30;
  pfStack_10e70 = &fStack_10d30;
  fStack_10e88 = 0xffffffffffffffff;
  pfVar7 = &fStack_10c30;
  pfStack_10ee8 = (fdb_config *)0x110631;
  fdb_get_default_config();
  fStack_10c30.purging_interval = 1;
  fStack_10c30.seqtree_opt = '\x01';
  pfStack_10ee8 = (fdb_config *)0x110649;
  fdb_get_default_kvs_config();
  pfStack_10ee8 = (fdb_config *)0x11065d;
  fVar2 = fdb_open(&pfStack_10ec0,"./dummy1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10ee8 = (fdb_config *)0x11067e;
    fVar2 = fdb_kvs_open(pfStack_10ec0,&pfStack_10ec8,(char *)0x0,&fStack_10e58);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c7;
    builtin_memcpy(auStack_10e30,"key",4);
    pfVar7 = &fStack_10d30;
    fStack_10d30.chunksize = 0x6f62;
    fStack_10d30._2_2_ = 0x7964;
    fStack_10d30.blocksize._0_1_ = 0;
    pfStack_10ee8 = (fdb_config *)0x1106ab;
    auStack_10eb0._0_8_ = strlen((char *)auStack_10e30);
    pfVar9 = (fdb_config *)auStack_10eb0;
    pfStack_10ee8 = (fdb_config *)0x1106bb;
    auStack_10eb0._16_8_ = strlen((char *)pfVar7);
    pfStack_10ee8 = (fdb_config *)0x1106cc;
    fVar2 = fdb_set(pfStack_10ec8,(fdb_doc *)pfVar9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108cc;
    pfStack_10ee8 = (fdb_config *)0x1106e3;
    fVar2 = fdb_commit(pfStack_10ec0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d1;
    pfStack_10ee8 = (fdb_config *)0x1106fa;
    fVar2 = fdb_del(pfStack_10ec8,(fdb_doc *)auStack_10eb0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d6;
    pfStack_10ee8 = (fdb_config *)0x110711;
    fVar2 = fdb_commit(pfStack_10ec0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108db;
    pfVar7 = (fdb_config *)&pfStack_10ed0;
    pfStack_10ee8 = (fdb_config *)0x110743;
    fdb_doc_create((fdb_doc **)pfVar7,auStack_10e30,auStack_10eb0._0_8_,(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_10ee8 = (fdb_config *)0x110750;
    fVar2 = fdb_get_metaonly(pfStack_10ec8,pfStack_10ed0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e0;
    pfVar12 = pfStack_10ed0;
    if (pfStack_10ed0->deleted == false) {
      pfVar7 = (fdb_config *)&pfStack_10eb8;
      pfStack_10ee8 = (fdb_config *)0x110775;
      deleted_doc_get_api_test();
      pfVar12 = pfStack_10eb8;
    }
    pfVar12->deleted = false;
    pfStack_10ee8 = (fdb_config *)0x110786;
    fVar2 = fdb_get_metaonly_byseq(pfStack_10ec8,pfVar12);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e5;
    pfVar12 = pfStack_10ed0;
    if (pfStack_10ed0->deleted == false) {
      pfVar7 = (fdb_config *)&pfStack_10eb8;
      pfStack_10ee8 = (fdb_config *)0x1107ab;
      deleted_doc_get_api_test();
      pfVar12 = pfStack_10eb8;
    }
    pfVar12->deleted = false;
    pfStack_10ee8 = (fdb_config *)0x1107bc;
    fVar2 = fdb_get_byoffset(pfStack_10ec8,pfVar12);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ea;
    pfVar12 = pfStack_10ed0;
    if (pfStack_10ed0->deleted == false) {
      pfVar7 = (fdb_config *)&pfStack_10eb8;
      pfStack_10ee8 = (fdb_config *)0x1107e2;
      deleted_doc_get_api_test();
      pfVar12 = pfStack_10eb8;
    }
    pfVar12->deleted = false;
    pfStack_10ee8 = (fdb_config *)0x1107f3;
    fVar2 = fdb_get(pfStack_10ec8,pfVar12);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ef;
    pfVar12 = pfStack_10ed0;
    if (pfStack_10ed0->deleted == true) {
      pfVar7 = (fdb_config *)&pfStack_10eb8;
      pfStack_10ee8 = (fdb_config *)0x110819;
      deleted_doc_get_api_test();
      pfVar12 = pfStack_10eb8;
    }
    pfVar12->deleted = false;
    pfStack_10ee8 = (fdb_config *)0x11082a;
    fVar2 = fdb_get_byseq(pfStack_10ec8,pfVar12);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f4;
    if (pfStack_10ed0->deleted == true) {
      pfVar7 = (fdb_config *)&pfStack_10eb8;
      pfStack_10ee8 = (fdb_config *)0x110850;
      deleted_doc_get_api_test();
      pfStack_10ed0 = pfStack_10eb8;
    }
    pfStack_10ee8 = (fdb_config *)0x110858;
    fdb_doc_free(pfStack_10ed0);
    pfStack_10ee8 = (fdb_config *)0x110862;
    fVar2 = fdb_kvs_close(pfStack_10ec8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f9;
    pfStack_10ee8 = (fdb_config *)0x110874;
    fVar2 = fdb_close(pfStack_10ec0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10ee8 = (fdb_config *)0x110881;
      fdb_shutdown();
      pfStack_10ee8 = (fdb_config *)0x110886;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_10ee8 = (fdb_config *)0x1108b7;
      fprintf(_stderr,pcVar4,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_10ee8 = (fdb_config *)0x1108c7;
    deleted_doc_get_api_test();
LAB_001108c7:
    pfStack_10ee8 = (fdb_config *)0x1108cc;
    deleted_doc_get_api_test();
LAB_001108cc:
    pfStack_10ee8 = (fdb_config *)0x1108d1;
    deleted_doc_get_api_test();
LAB_001108d1:
    pfStack_10ee8 = (fdb_config *)0x1108d6;
    deleted_doc_get_api_test();
LAB_001108d6:
    pfStack_10ee8 = (fdb_config *)0x1108db;
    deleted_doc_get_api_test();
LAB_001108db:
    pfStack_10ee8 = (fdb_config *)0x1108e0;
    deleted_doc_get_api_test();
LAB_001108e0:
    pfStack_10ee8 = (fdb_config *)0x1108e5;
    deleted_doc_get_api_test();
LAB_001108e5:
    pfStack_10ee8 = (fdb_config *)0x1108ea;
    deleted_doc_get_api_test();
LAB_001108ea:
    pfStack_10ee8 = (fdb_config *)0x1108ef;
    deleted_doc_get_api_test();
LAB_001108ef:
    pfStack_10ee8 = (fdb_config *)0x1108f4;
    deleted_doc_get_api_test();
LAB_001108f4:
    pfStack_10ee8 = (fdb_config *)0x1108f9;
    deleted_doc_get_api_test();
LAB_001108f9:
    pfStack_10ee8 = (fdb_config *)0x1108fe;
    deleted_doc_get_api_test();
  }
  pfStack_10ee8 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pfStack_112d0 = (fdb_config *)0x11091c;
  pfStack_10ef0 = pfVar7;
  pfStack_10ee8 = pfVar9;
  gettimeofday(&tStack_11240,(__timezone_ptr_t)0x0);
  pfStack_112d0 = (fdb_config *)0x110921;
  memleak_start();
  pfStack_112d0 = (fdb_config *)0x11092d;
  system("rm -rf  dummy* > errorlog.txt");
  auStack_112a8._24_8_ = 0;
  pvStack_11270 = (void *)0x0;
  uStack_11278 = 0;
  auStack_112a8._8_8_ = 0;
  auStack_112a8._16_8_ = 0;
  uStack_11260 = 0;
  auStack_112a8._32_8_ = acStack_110e8;
  pfStack_11268 = &fStack_111e8;
  fStack_11280 = 0xffffffffffffffff;
  pfVar7 = &fStack_10fe8;
  pfStack_112d0 = (fdb_config *)0x110980;
  fdb_get_default_config();
  fStack_10fe8.purging_interval = 0;
  pfStack_112d0 = (fdb_config *)0x110991;
  fdb_get_default_kvs_config();
  pfStack_112d0 = (fdb_config *)0x1109a5;
  fVar2 = fdb_open(&pfStack_112c0,"./dummy1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_112d0 = (fdb_config *)0x1109c8;
    fVar2 = fdb_kvs_open(pfStack_112c0,&pfStack_112b8,"main",&fStack_11258);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b48;
    acStack_110e8[0] = 'K';
    acStack_110e8[1] = '\0';
    pfVar7 = &fStack_111e8;
    fStack_111e8.chunksize = 0x6f62;
    fStack_111e8._2_2_ = 0x7964;
    fStack_111e8.blocksize._0_1_ = 0;
    pfStack_112d0 = (fdb_config *)0x1109f4;
    sVar5 = strlen(acStack_110e8);
    auStack_112a8._0_8_ = sVar5 + 1;
    pfVar9 = (fdb_config *)auStack_112a8;
    pfStack_112d0 = (fdb_config *)0x110a07;
    sVar5 = strlen((char *)pfVar7);
    auStack_112a8._16_8_ = sVar5 + 1;
    pfStack_112d0 = (fdb_config *)0x110a1b;
    fVar2 = fdb_set(pfStack_112b8,(fdb_doc *)pfVar9);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4d;
    pfStack_112d0 = (fdb_config *)0x110a32;
    fVar2 = fdb_del(pfStack_112b8,(fdb_doc *)auStack_112a8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b52;
    pfVar7 = (fdb_config *)&pfStack_112b0;
    pfStack_112d0 = (fdb_config *)0x110a61;
    fdb_doc_create((fdb_doc **)pfVar7,(void *)auStack_112a8._32_8_,auStack_112a8._0_8_,(void *)0x0,0
                   ,(void *)0x0,0);
    pfStack_112d0 = (fdb_config *)0x110a6e;
    fVar2 = fdb_get(pfStack_112b8,pfStack_112b0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b57;
    pfStack_112d0 = (fdb_config *)0x110a81;
    fdb_doc_free(pfStack_112b0);
    pfStack_112d0 = (fdb_config *)0x110a93;
    fdb_get_file_info(pfStack_112c0,(fdb_file_info *)auStack_11230);
    pfVar7 = (fdb_config *)(auStack_11230 + 0x10);
    if (auStack_11230._16_8_ != 0) {
      pfStack_112d0 = (fdb_config *)0x110aa9;
      deleted_doc_stat_test();
    }
    pfStack_112d0 = (fdb_config *)0x110ab5;
    fVar2 = fdb_commit(pfStack_112c0,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5c;
    pfVar9 = (fdb_config *)auStack_11230;
    pfStack_112d0 = (fdb_config *)0x110ad2;
    fdb_get_file_info(pfStack_112c0,(fdb_file_info *)pfVar9);
    if (auStack_11230._16_8_ != 0) {
      pfStack_112d0 = (fdb_config *)0x110ae1;
      deleted_doc_stat_test();
    }
    pfStack_112d0 = (fdb_config *)0x110aeb;
    fVar2 = fdb_kvs_close(pfStack_112b8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b61;
    pfStack_112d0 = (fdb_config *)0x110af9;
    fVar2 = fdb_close(pfStack_112c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_112d0 = (fdb_config *)0x110b02;
      fdb_shutdown();
      pfStack_112d0 = (fdb_config *)0x110b07;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_112d0 = (fdb_config *)0x110b38;
      fprintf(_stderr,pcVar4,"deleted doc stat test");
      return;
    }
  }
  else {
    pfStack_112d0 = (fdb_config *)0x110b48;
    deleted_doc_stat_test();
LAB_00110b48:
    pfStack_112d0 = (fdb_config *)0x110b4d;
    deleted_doc_stat_test();
LAB_00110b4d:
    pfStack_112d0 = (fdb_config *)0x110b52;
    deleted_doc_stat_test();
LAB_00110b52:
    pfStack_112d0 = (fdb_config *)0x110b57;
    deleted_doc_stat_test();
LAB_00110b57:
    pfStack_112d0 = (fdb_config *)0x110b5c;
    deleted_doc_stat_test();
LAB_00110b5c:
    pfStack_112d0 = (fdb_config *)0x110b61;
    deleted_doc_stat_test();
LAB_00110b61:
    pfStack_112d0 = (fdb_config *)0x110b66;
    deleted_doc_stat_test();
  }
  pfStack_112d0 = (fdb_config *)complete_delete_test;
  deleted_doc_stat_test();
  pfStack_11758 = (fdb_config *)0x110b88;
  pfStack_112f8 = pfVar7;
  pfStack_112f0 = unaff_R12;
  pfStack_112e8 = unaff_R13;
  pfStack_112e0 = pfVar9;
  pfStack_112d8 = (fdb_config *)unaff_R15;
  pfStack_112d0 = unaff_RBP;
  gettimeofday(&tStack_11728,(__timezone_ptr_t)0x0);
  pfStack_11758 = (fdb_config *)0x110b8d;
  memleak_start();
  pcVar4 = acStack_11400;
  builtin_strncpy(acStack_11400,"./dummy1",9);
  pfStack_11758 = (fdb_config *)0x110bb2;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar9 = &fStack_114f8;
  pfStack_11758 = (fdb_config *)0x110bc2;
  fdb_get_default_config();
  fStack_114f8.buffercache_size = 0;
  kvs_config_00 = &fStack_11718.create_if_missing;
  pfStack_11758 = (fdb_config *)0x110bd7;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_11738;
  pfStack_11758 = (fdb_config *)0x110bea;
  fdb_open(ptr_fhandle,pcVar4,pfVar9);
  pfStack_11758 = (fdb_config *)0x110c02;
  fVar2 = fdb_kvs_open(pfStack_11738,&pfStack_11740,"db1",(fdb_kvs_config *)kvs_config_00);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9c;
  unaff_RBP = (fdb_config *)0x0;
  do {
    pfStack_11758 = (fdb_config *)0x110c33;
    sprintf((char *)&fStack_11600,"key%05d",unaff_RBP);
    pfStack_11758 = (fdb_config *)0x110c42;
    sprintf((char *)apfStack_11700,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_11740;
    pfStack_11758 = (fdb_config *)0x110c4f;
    sVar5 = strlen((char *)&fStack_11600);
    pcVar4 = (char *)(sVar5 + 1);
    pfStack_11758 = (fdb_config *)0x110c5b;
    sVar5 = strlen((char *)apfStack_11700);
    pfStack_11758 = (fdb_config *)0x110c70;
    fVar2 = fdb_set_kv(unaff_R13,&fStack_11600,(size_t)pcVar4,apfStack_11700,sVar5 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_11758 = (fdb_config *)0x110d97;
      complete_delete_test();
      goto LAB_00110d97;
    }
    uVar11 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_config *)(ulong)uVar11;
  } while (uVar11 != 1000);
  pfStack_11758 = (fdb_config *)0x110c91;
  fdb_commit(pfStack_11738,'\x01');
  pcVar4 = "key%05d";
  pfVar9 = &fStack_11600;
  kvs_config_00 = "value%05d";
  ptr_fhandle = apfStack_11700;
  unaff_RBP = (fdb_config *)0x0;
  do {
    pfStack_11758 = (fdb_config *)0x110cbd;
    sprintf((char *)pfVar9,"key%05d",unaff_RBP);
    pfStack_11758 = (fdb_config *)0x110ccc;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_11740;
    pfStack_11758 = (fdb_config *)0x110cd9;
    sVar5 = strlen((char *)pfVar9);
    pfStack_11758 = (fdb_config *)0x110ce8;
    fVar2 = fdb_del_kv(unaff_R13,pfVar9,sVar5 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d97;
    uVar11 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_config *)(ulong)uVar11;
  } while (uVar11 != 1000);
  pfStack_11758 = (fdb_config *)0x110d09;
  fdb_commit(pfStack_11738,'\x01');
  pfStack_11758 = (fdb_config *)0x110d29;
  fVar2 = fdb_iterator_init(pfStack_11740,&pfStack_11730,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110da1;
  pfStack_11758 = (fdb_config *)0x110d37;
  fVar2 = fdb_iterator_close(pfStack_11730);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11758 = (fdb_config *)0x110d45;
    fdb_close(pfStack_11738);
    pfStack_11758 = (fdb_config *)0x110d4a;
    fdb_shutdown();
    pfStack_11758 = (fdb_config *)0x110d4f;
    memleak_end();
    pcVar4 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar4 = "%s FAILED\n";
    }
    pfStack_11758 = (fdb_config *)0x110d80;
    fprintf(_stderr,pcVar4,"complete delete");
    return;
  }
  goto LAB_00110da6;
LAB_00110d97:
  pfVar9 = &fStack_11600;
  ptr_fhandle = apfStack_11700;
  kvs_config_00 = "value%05d";
  pfStack_11758 = (fdb_config *)0x110d9c;
  complete_delete_test();
LAB_00110d9c:
  pfStack_11758 = (fdb_config *)0x110da1;
  complete_delete_test();
LAB_00110da1:
  pfStack_11758 = (fdb_config *)0x110da6;
  complete_delete_test();
LAB_00110da6:
  pfStack_11758 = (fdb_config *)large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_11bd0 = (fdb_config *)0x110dc8;
  pcStack_11780 = pcVar4;
  ppfStack_11778 = ptr_fhandle;
  pfStack_11770 = unaff_R13;
  pfStack_11768 = pfVar9;
  pfStack_11760 = (fdb_kvs_config *)kvs_config_00;
  pfStack_11758 = unaff_RBP;
  gettimeofday(&tStack_11b98,(__timezone_ptr_t)0x0);
  pfStack_11bd0 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_11bd0 = (fdb_config *)0x110dd7;
  pfVar7 = (fdb_config *)malloc(4000000);
  pfStack_11bd0 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar9 = &fStack_11a80;
  pfStack_11bd0 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_11bd0 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_11bd0 = (fdb_config *)0x110e14;
  fVar2 = fdb_open(&pfStack_11bc0,"./dummy1",pfVar9);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11bd0 = (fdb_config *)0x110e32;
    fVar2 = fdb_kvs_open(pfStack_11bc0,&pfStack_11bb8,(char *)0x0,&fStack_11bb0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    pcVar4 = (char *)0x0;
    uVar8 = 0;
    do {
      pfStack_11bd0 = (fdb_config *)0x110e5b;
      sprintf(acStack_11888,"key%128d",uVar8 & 0xffffffff);
      pfStack_11bd0 = (fdb_config *)0x110e77;
      sprintf(acStack_11988,"meta%128d",uVar8 & 0xffffffff);
      pfStack_11bd0 = (fdb_config *)0x110e8d;
      sprintf(acStack_11b88,"body%128d",uVar8 & 0xffffffff);
      pfStack_11bd0 = (fdb_config *)0x110e99;
      sVar5 = strlen(acStack_11888);
      pfStack_11bd0 = (fdb_config *)0x110ea7;
      metalen_00 = strlen(acStack_11988);
      pfStack_11bd0 = (fdb_config *)0x110eb4;
      bodylen = strlen(acStack_11b88);
      pfStack_11bd0 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)(pcVar4 + (long)&pfVar7->chunksize),acStack_11888,sVar5,
                     acStack_11988,metalen_00,acStack_11b88,bodylen);
      pfStack_11bd0 = (fdb_config *)0x110eec;
      fdb_set(pfStack_11bb8,*(fdb_doc **)(&pfVar7->chunksize + uVar8 * 4));
      pfStack_11bd0 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&pfVar7->chunksize + uVar8 * 4));
      uVar8 = uVar8 + 1;
      pcVar4 = pcVar4 + 8;
    } while (uVar8 != 500000);
    pfStack_11bd0 = (fdb_config *)0x110f13;
    fVar2 = fdb_kvs_close(pfStack_11bb8);
    pfVar9 = pfVar7;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_11bd0 = (fdb_config *)0x110f25;
    fVar2 = fdb_close(pfStack_11bc0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_11bd0 = (fdb_config *)0x110f46;
    fVar2 = fdb_open(&pfStack_11bc0,"./dummy1",&fStack_11a80);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_11bd0 = (fdb_config *)0x110f65;
      free(pfVar7);
      pfStack_11bd0 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_11bd0 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_11bd0 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar4,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_11bd0 = (fdb_config *)0x110f59;
      fVar2 = fdb_close(pfStack_11bc0);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_11bd0 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_11bd0 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_11bd0 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_11bd0 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_11bd0 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_11bd0 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_11be0 = pcVar4;
  pfStack_11bd8 = pfVar9;
  pfStack_11bd0 = pfVar7;
  gettimeofday(&tStack_11e00,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_11dd8.wal_threshold = 0x400;
  fStack_11dd8.seqtree_opt = '\x01';
  fStack_11dd8.purging_interval = 1;
  fStack_11dd8.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_11e08,"./dummy1",&fStack_11dd8);
  fdb_kvs_open(pfStack_11e08,&pfStack_11e10,"db1",&fStack_11df0);
  sprintf(acStack_11ce0,"key%d",0);
  sVar5 = strlen(acStack_11ce0);
  fdb_doc_create(&pfStack_11e18,acStack_11ce0,sVar5,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_11e10,pfStack_11e18);
  fVar2 = fdb_get(pfStack_11e10,pfStack_11e18);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_11e10,pfStack_11e18);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_11e10,pfStack_11e18);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_11e10,pfStack_11e18);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_11e10,pfStack_11e18);
        fVar2 = fdb_get(pfStack_11e10,pfStack_11e18);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_11e18->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_11e10,pfStack_11e18);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x353,"void set_get_meta_test()");
          }
          if (pfStack_11e18->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x354,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly_byseq(pfStack_11e10,pfStack_11e18);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_11e18->deleted != false) {
              fVar2 = fdb_get_byoffset(pfStack_11e10,pfStack_11e18);
              if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                if (pfStack_11e18->deleted != false) {
                  fdb_doc_free(pfStack_11e18);
                  fdb_kvs_close(pfStack_11e10);
                  fdb_close(pfStack_11e08);
                  fdb_shutdown();
                  memleak_end();
                  pcVar4 = "%s PASSED\n";
                  if (set_get_meta_test()::__test_pass != '\0') {
                    pcVar4 = "%s FAILED\n";
                  }
                  fprintf(_stderr,pcVar4,"set get meta test");
                  return;
                }
              }
              else {
                set_get_meta_test();
              }
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x35c,"void set_get_meta_test()");
            }
          }
          else {
            set_get_meta_test();
          }
          __assert_fail("rdoc->deleted == true",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x358,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void basic_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_rdonly;
    fdb_kvs_handle *db;
    fdb_kvs_handle *db_rdonly;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    // Get the ForestDB version
    const char *version = fdb_get_lib_version();
    TEST_CHK(version != NULL && strlen(version) > 0);

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // Read-Write mode test without a create flag.
    fconfig.flags = 0;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);
    TEST_CHK(!strcmp(fdb_error_msg(status), "no such file"));

    // Read-Only mode test: Must not create new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    // Read-Only and Create mode: Must not create a new file.
    fconfig.flags = FDB_OPEN_FLAG_RDONLY | FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_INVALID_CONFIG);
    TEST_CHK(!strcmp(fdb_error_msg(status), "invalid configuration"));

    // open and close db with a create flag.
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(!strcmp(fdb_error_msg(status), "success"));
    const char *file_version = fdb_get_file_version(dbfile);
    TEST_CHK(file_version != NULL && strlen(file_version) > 0);
    fdb_close(dbfile);

    // reopen db
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;
    fdb_open(&dbfile, "./dummy1",&fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // check the file info
    fdb_file_info info;
    fdb_get_file_info(dbfile, &info);
    TEST_CHK(info.doc_count == 9);
    TEST_CHK(info.deleted_count == 1);
    TEST_CHK(info.space_used > 0);
    TEST_CHK(info.num_kv_stores == 1);

    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get_metaonly(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(rdoc->deleted == true);
    TEST_CMP(rdoc->meta, doc[5]->meta, rdoc->metalen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc, (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "meta2%d", i);
        sprintf(bodybuf, "body2%d", i);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            TEST_CHK(!strcmp(fdb_error_msg(status), "key not found"));
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // retrieve documents by sequence number
    for (i=0; i < n+3; ++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);
        if ( (i>=2 && i<=4) || (i>=6 && i<=9) || (i>=11 && i<=12)) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // update document #5 with an empty doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta,
                   doc[5]->metalen, NULL, 0);
    status = fdb_set(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Check document #5 with respect to metadata and doc body.
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(memcmp(rdoc->meta, doc[5]->meta, rdoc->metalen) == 0);
    TEST_CHK(rdoc->body == NULL);
    TEST_CHK(rdoc->bodylen == 0);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // Read-Only mode test: Open succeeds if file exists, but disallow writes
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile_rdonly, "./dummy2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile_rdonly, &db_rdonly, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, doc[0]->key, doc[0]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db_rdonly, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db_rdonly, logCallbackFunc,
                                  (void *) "basic_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db_rdonly, doc[i]);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);
    TEST_CHK(!strcmp(fdb_error_msg(status), "database is read-only"));

    status = fdb_commit(dbfile_rdonly, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_RONLY_VIOLATION);

    fdb_doc_free(rdoc);
    rdoc = NULL;
    fdb_kvs_close(db_rdonly);
    fdb_close(dbfile_rdonly);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // do one more compaction
    fdb_compact(dbfile, (char *) "./dummy3");

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("basic test");
}